

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::DiscMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  float fVar29;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar46 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  Primitive *local_318;
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar47 [64];
  undefined1 auVar65 [64];
  undefined1 auVar73 [64];
  
  pSVar6 = context->scene;
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  lVar8 = *(long *)&pGVar7->field_0x58;
  _Var9 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar21._16_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[4] * _Var9);
  auVar21._0_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[0] * _Var9);
  auVar25._16_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[5] * _Var9);
  auVar25._0_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[1] * _Var9);
  auVar27._16_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[6] * _Var9);
  auVar27._0_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[2] * _Var9);
  auVar30._16_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[7] * _Var9);
  auVar30._0_16_ = *(undefined1 (*) [16])(lVar8 + (Disc->primIDs).field_0.i[3] * _Var9);
  auVar22 = vunpcklps_avx(auVar21,auVar27);
  auVar12 = vunpckhps_avx(auVar21,auVar27);
  auVar13 = vunpcklps_avx(auVar25,auVar30);
  auVar30 = vunpckhps_avx(auVar25,auVar30);
  auVar21 = vunpcklps_avx(auVar22,auVar13);
  auVar13 = vunpckhps_avx(auVar22,auVar13);
  auVar27 = vunpcklps_avx(auVar12,auVar30);
  local_250 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_260 = local_250;
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  auVar21 = vsubps_avx(auVar21,auVar22);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  auVar58._16_4_ = uVar1;
  auVar58._20_4_ = uVar1;
  auVar58._24_4_ = uVar1;
  auVar58._28_4_ = uVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x80);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar62 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar62 = vshufps_avx(auVar62,auVar62,0);
  auVar63._16_16_ = auVar62;
  auVar63._0_16_ = auVar62;
  auVar22 = vrcpps_avx(auVar63);
  auVar25 = vsubps_avx(auVar13,auVar54);
  auVar27 = vsubps_avx(auVar27,auVar58);
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = 0x3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar55._16_4_ = 0x3f800000;
  auVar55._20_4_ = 0x3f800000;
  auVar55._24_4_ = 0x3f800000;
  auVar55._28_4_ = 0x3f800000;
  fVar64 = auVar22._0_4_;
  fVar66 = auVar22._4_4_;
  auVar13._4_4_ = fVar66 * auVar62._4_4_;
  auVar13._0_4_ = fVar64 * auVar62._0_4_;
  fVar67 = auVar22._8_4_;
  auVar13._8_4_ = fVar67 * auVar62._8_4_;
  fVar68 = auVar22._12_4_;
  auVar13._12_4_ = fVar68 * auVar62._12_4_;
  fVar69 = auVar22._16_4_;
  auVar13._16_4_ = fVar69 * auVar62._0_4_;
  fVar70 = auVar22._20_4_;
  auVar13._20_4_ = fVar70 * auVar62._4_4_;
  fVar71 = auVar22._24_4_;
  auVar13._24_4_ = fVar71 * auVar62._8_4_;
  auVar13._28_4_ = uVar1;
  auVar13 = vsubps_avx(auVar55,auVar13);
  fVar45 = auVar27._0_4_;
  fVar48 = auVar27._4_4_;
  fVar49 = auVar27._8_4_;
  fVar50 = auVar27._12_4_;
  fVar51 = auVar27._16_4_;
  fVar52 = auVar27._20_4_;
  fVar53 = auVar27._24_4_;
  fVar38 = auVar25._0_4_;
  fVar39 = auVar25._4_4_;
  fVar40 = auVar25._8_4_;
  fVar41 = auVar25._12_4_;
  fVar42 = auVar25._16_4_;
  fVar43 = auVar25._20_4_;
  fVar44 = auVar25._24_4_;
  fVar29 = auVar21._0_4_;
  fVar32 = auVar21._4_4_;
  fVar33 = auVar21._8_4_;
  fVar34 = auVar21._12_4_;
  fVar35 = auVar21._16_4_;
  fVar36 = auVar21._20_4_;
  fVar37 = auVar21._24_4_;
  fVar64 = (fVar29 * fVar2 + fVar38 * fVar3 + fVar45 * fVar4) * (fVar64 + fVar64 * auVar13._0_4_);
  fVar66 = (fVar32 * fVar2 + fVar39 * fVar3 + fVar48 * fVar4) * (fVar66 + fVar66 * auVar13._4_4_);
  local_200._4_4_ = fVar66;
  local_200._0_4_ = fVar64;
  fVar67 = (fVar33 * fVar2 + fVar40 * fVar3 + fVar49 * fVar4) * (fVar67 + fVar67 * auVar13._8_4_);
  local_200._8_4_ = fVar67;
  fVar68 = (fVar34 * fVar2 + fVar41 * fVar3 + fVar50 * fVar4) * (fVar68 + fVar68 * auVar13._12_4_);
  local_200._12_4_ = fVar68;
  fVar69 = (fVar35 * fVar2 + fVar42 * fVar3 + fVar51 * fVar4) * (fVar69 + fVar69 * auVar13._16_4_);
  local_200._16_4_ = fVar69;
  fVar70 = (fVar36 * fVar2 + fVar43 * fVar3 + fVar52 * fVar4) * (fVar70 + fVar70 * auVar13._20_4_);
  local_200._20_4_ = fVar70;
  fVar71 = (fVar37 * fVar2 + fVar44 * fVar3 + fVar53 * fVar4) * (fVar71 + fVar71 * auVar13._24_4_);
  local_200._24_4_ = fVar71;
  local_200._28_4_ = auVar22._28_4_;
  auVar65 = ZEXT3264(local_200);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar56._16_4_ = uVar1;
  auVar56._20_4_ = uVar1;
  auVar56._24_4_ = uVar1;
  auVar56._28_4_ = uVar1;
  auVar22 = vcmpps_avx(auVar56,local_200,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar72._4_4_ = uVar1;
  auVar72._0_4_ = uVar1;
  auVar72._8_4_ = uVar1;
  auVar72._12_4_ = uVar1;
  auVar72._16_4_ = uVar1;
  auVar72._20_4_ = uVar1;
  auVar72._24_4_ = uVar1;
  auVar72._28_4_ = uVar1;
  auVar73 = ZEXT3264(auVar72);
  auVar13 = vcmpps_avx(local_200,auVar72,2);
  auVar22 = vandps_avx(auVar22,auVar13);
  auVar62 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar59._16_16_ = auVar62;
  auVar59._0_16_ = auVar62;
  auVar13 = vcvtdq2ps_avx(auVar59);
  auVar13 = vcmpps_avx(_DAT_01faff40,auVar13,1);
  auVar54 = auVar13 & auVar22;
  if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar54 >> 0x7f,0) != '\0') ||
        (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar54 >> 0xbf,0) != '\0') ||
      (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar54[0x1f] < '\0') {
    auVar22 = vandps_avx(auVar22,auVar13);
    auVar54 = vunpckhps_avx(auVar12,auVar30);
    auVar12._4_4_ = fVar66 * fVar2;
    auVar12._0_4_ = fVar64 * fVar2;
    auVar12._8_4_ = fVar67 * fVar2;
    auVar12._12_4_ = fVar68 * fVar2;
    auVar12._16_4_ = fVar69 * fVar2;
    auVar12._20_4_ = fVar70 * fVar2;
    auVar12._24_4_ = fVar71 * fVar2;
    auVar12._28_4_ = auVar30._28_4_;
    auVar14._4_4_ = fVar66 * fVar3;
    auVar14._0_4_ = fVar64 * fVar3;
    auVar14._8_4_ = fVar67 * fVar3;
    auVar14._12_4_ = fVar68 * fVar3;
    auVar14._16_4_ = fVar69 * fVar3;
    auVar14._20_4_ = fVar70 * fVar3;
    auVar14._24_4_ = fVar71 * fVar3;
    auVar14._28_4_ = auVar13._28_4_;
    auVar16._4_4_ = fVar66 * fVar4;
    auVar16._0_4_ = fVar64 * fVar4;
    auVar16._8_4_ = fVar67 * fVar4;
    auVar16._12_4_ = fVar68 * fVar4;
    auVar16._16_4_ = fVar69 * fVar4;
    auVar16._20_4_ = fVar70 * fVar4;
    auVar16._24_4_ = fVar71 * fVar4;
    auVar16._28_4_ = DAT_01faff40._28_4_;
    auVar13 = vsubps_avx(auVar21,auVar12);
    auVar12 = vsubps_avx(auVar25,auVar14);
    auVar30 = vsubps_avx(auVar27,auVar16);
    auVar60._0_4_ =
         auVar12._0_4_ * auVar12._0_4_ + auVar30._0_4_ * auVar30._0_4_ +
         auVar13._0_4_ * auVar13._0_4_;
    auVar60._4_4_ =
         auVar12._4_4_ * auVar12._4_4_ + auVar30._4_4_ * auVar30._4_4_ +
         auVar13._4_4_ * auVar13._4_4_;
    auVar60._8_4_ =
         auVar12._8_4_ * auVar12._8_4_ + auVar30._8_4_ * auVar30._8_4_ +
         auVar13._8_4_ * auVar13._8_4_;
    auVar60._12_4_ =
         auVar12._12_4_ * auVar12._12_4_ + auVar30._12_4_ * auVar30._12_4_ +
         auVar13._12_4_ * auVar13._12_4_;
    auVar60._16_4_ =
         auVar12._16_4_ * auVar12._16_4_ + auVar30._16_4_ * auVar30._16_4_ +
         auVar13._16_4_ * auVar13._16_4_;
    auVar60._20_4_ =
         auVar12._20_4_ * auVar12._20_4_ + auVar30._20_4_ * auVar30._20_4_ +
         auVar13._20_4_ * auVar13._20_4_;
    auVar60._24_4_ =
         auVar12._24_4_ * auVar12._24_4_ + auVar30._24_4_ * auVar30._24_4_ +
         auVar13._24_4_ * auVar13._24_4_;
    auVar60._28_4_ = auVar12._28_4_ + auVar30._28_4_ + auVar13._28_4_;
    auVar15._4_4_ = auVar54._4_4_ * auVar54._4_4_;
    auVar15._0_4_ = auVar54._0_4_ * auVar54._0_4_;
    auVar15._8_4_ = auVar54._8_4_ * auVar54._8_4_;
    auVar15._12_4_ = auVar54._12_4_ * auVar54._12_4_;
    auVar15._16_4_ = auVar54._16_4_ * auVar54._16_4_;
    auVar15._20_4_ = auVar54._20_4_ * auVar54._20_4_;
    auVar15._24_4_ = auVar54._24_4_ * auVar54._24_4_;
    auVar15._28_4_ = auVar13._28_4_;
    auVar13 = vcmpps_avx(auVar60,auVar15,2);
    auVar12 = auVar22 & auVar13;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar22 = vandps_avx(auVar22,auVar13);
      auVar31._0_4_ = fVar29 * fVar29 + fVar38 * fVar38 + fVar45 * fVar45;
      auVar31._4_4_ = fVar32 * fVar32 + fVar39 * fVar39 + fVar48 * fVar48;
      auVar31._8_4_ = fVar33 * fVar33 + fVar40 * fVar40 + fVar49 * fVar49;
      auVar31._12_4_ = fVar34 * fVar34 + fVar41 * fVar41 + fVar50 * fVar50;
      auVar31._16_4_ = fVar35 * fVar35 + fVar42 * fVar42 + fVar51 * fVar51;
      auVar31._20_4_ = fVar36 * fVar36 + fVar43 * fVar43 + fVar52 * fVar52;
      auVar31._24_4_ = fVar37 * fVar37 + fVar44 * fVar44 + fVar53 * fVar53;
      auVar31._28_4_ = auVar21._28_4_ + auVar25._28_4_ + auVar27._28_4_;
      auVar13 = vcmpps_avx(auVar31,auVar15,6);
      auVar21 = auVar22 & auVar13;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        local_2e0 = vandps_avx(auVar13,auVar22);
        local_220 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_240 = local_220;
        local_1e0[0] = -fVar2;
        local_1e0[1] = -fVar2;
        local_1e0[2] = -fVar2;
        local_1e0[3] = -fVar2;
        fStack_1d0 = -fVar2;
        fStack_1cc = -fVar2;
        fStack_1c8 = -fVar2;
        fStack_1c4 = -fVar2;
        local_1c0[0] = -fVar3;
        local_1c0[1] = -fVar3;
        local_1c0[2] = -fVar3;
        local_1c0[3] = -fVar3;
        fStack_1b0 = -fVar3;
        fStack_1ac = -fVar3;
        fStack_1a8 = -fVar3;
        fStack_1a4 = -fVar3;
        local_1a0[0] = -fVar4;
        local_1a0[1] = -fVar4;
        local_1a0[2] = -fVar4;
        local_1a0[3] = -fVar4;
        fStack_190 = -fVar4;
        fStack_18c = -fVar4;
        fStack_188 = -fVar4;
        fStack_184 = -fVar4;
        auVar46._8_4_ = 0x7f800000;
        auVar46._0_8_ = 0x7f8000007f800000;
        auVar46._12_4_ = 0x7f800000;
        auVar46._16_4_ = 0x7f800000;
        auVar46._20_4_ = 0x7f800000;
        auVar46._24_4_ = 0x7f800000;
        auVar46._28_4_ = 0x7f800000;
        auVar47 = ZEXT3264(auVar46);
        auVar22 = vblendvps_avx(auVar46,local_200,local_2e0);
        auVar13 = vshufps_avx(auVar22,auVar22,0xb1);
        auVar13 = vminps_avx(auVar22,auVar13);
        auVar21 = vshufpd_avx(auVar13,auVar13,5);
        auVar13 = vminps_avx(auVar13,auVar21);
        auVar21 = vperm2f128_avx(auVar13,auVar13,1);
        auVar13 = vminps_avx(auVar13,auVar21);
        auVar13 = vcmpps_avx(auVar22,auVar13,0);
        auVar21 = local_2e0 & auVar13;
        auVar22 = local_2e0;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0x7f,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0xbf,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar21[0x1f] < '\0') {
          auVar22 = vandps_avx(auVar13,local_2e0);
        }
        uVar17 = vmovmskps_avx(auVar22);
        uVar19 = 1 << ((byte)k & 0x1f);
        uVar18 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        auVar22 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar22 = vcmpps_avx(auVar22,auVar22,0xf);
        auVar57 = ZEXT3264(auVar22);
        auVar61 = ZEXT464(0) << 0x20;
        do {
          local_310.hit = local_180;
          local_310.valid = (int *)local_340;
          uVar20 = (ulong)uVar18;
          uVar18 = *(uint *)(local_260 + uVar20 * 4);
          pGVar7 = (pSVar6->geometries).items[uVar18].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_2e0 + uVar20 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar1 = *(undefined4 *)(local_240 + uVar20 * 4);
              uVar5 = *(undefined4 *)(local_220 + uVar20 * 4);
              *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar20 - 8];
              *(float *)(ray + k * 4 + 0x180) = local_1e0[uVar20];
              *(float *)(ray + k * 4 + 0x1a0) = local_1c0[uVar20];
              *(float *)(ray + k * 4 + 0x1c0) = local_1a0[uVar20];
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar5;
              *(uint *)(ray + k * 4 + 0x220) = (Disc->primIDs).field_0.i[uVar20];
              *(uint *)(ray + k * 4 + 0x240) = uVar18;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              return;
            }
            local_120 = *(undefined4 *)(local_240 + uVar20 * 4);
            local_100 = *(undefined4 *)(local_220 + uVar20 * 4);
            auStack_b0 = vpshufd_avx(ZEXT416(uVar18),0);
            local_e0 = (Disc->primIDs).field_0.i[uVar20];
            fVar2 = local_1e0[uVar20];
            fVar3 = local_1c0[uVar20];
            local_160._4_4_ = fVar3;
            local_160._0_4_ = fVar3;
            local_160._8_4_ = fVar3;
            local_160._12_4_ = fVar3;
            local_160._16_4_ = fVar3;
            local_160._20_4_ = fVar3;
            local_160._24_4_ = fVar3;
            local_160._28_4_ = fVar3;
            fVar3 = local_1a0[uVar20];
            local_140._4_4_ = fVar3;
            local_140._0_4_ = fVar3;
            local_140._8_4_ = fVar3;
            local_140._12_4_ = fVar3;
            local_140._16_4_ = fVar3;
            local_140._20_4_ = fVar3;
            local_140._24_4_ = fVar3;
            local_140._28_4_ = fVar3;
            local_180[0] = (RTCHitN)SUB41(fVar2,0);
            local_180[1] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[2] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[3] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[4] = (RTCHitN)SUB41(fVar2,0);
            local_180[5] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[6] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[7] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[8] = (RTCHitN)SUB41(fVar2,0);
            local_180[9] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[10] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0xb] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0xc] = (RTCHitN)SUB41(fVar2,0);
            local_180[0xd] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0xe] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0xf] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x10] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x11] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x12] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x13] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x14] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x15] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x16] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x17] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x18] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x19] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x1a] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x1b] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_180[0x1c] = (RTCHitN)SUB41(fVar2,0);
            local_180[0x1d] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_180[0x1e] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_180[0x1f] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            uStack_11c = local_120;
            uStack_118 = local_120;
            uStack_114 = local_120;
            uStack_110 = local_120;
            uStack_10c = local_120;
            uStack_108 = local_120;
            uStack_104 = local_120;
            uStack_fc = local_100;
            uStack_f8 = local_100;
            uStack_f4 = local_100;
            uStack_f0 = local_100;
            uStack_ec = local_100;
            uStack_e8 = local_100;
            uStack_e4 = local_100;
            uStack_dc = local_e0;
            uStack_d8 = local_e0;
            uStack_d4 = local_e0;
            uStack_d0 = local_e0;
            uStack_cc = local_e0;
            uStack_c8 = local_e0;
            uStack_c4 = local_e0;
            local_c0 = auStack_b0;
            local_2c0 = auVar57._0_32_;
            uStack_9c = context->user->instID[0];
            local_a0 = uStack_9c;
            uStack_98 = uStack_9c;
            uStack_94 = uStack_9c;
            uStack_90 = uStack_9c;
            uStack_8c = uStack_9c;
            uStack_88 = uStack_9c;
            uStack_84 = uStack_9c;
            uStack_7c = context->user->instPrimID[0];
            local_80 = uStack_7c;
            uStack_78 = uStack_7c;
            uStack_74 = uStack_7c;
            uStack_70 = uStack_7c;
            uStack_6c = uStack_7c;
            uStack_68 = uStack_7c;
            uStack_64 = uStack_7c;
            *(float *)(ray + k * 4 + 0x100) = local_1e0[uVar20 - 8];
            local_340 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar19 & 0xf) << 4));
            local_330 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar19 >> 4) * 0x10);
            local_310.geometryUserPtr = pGVar7->userPtr;
            local_310.context = context->user;
            local_310.N = 8;
            local_310.ray = (RTCRayN *)ray;
            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              local_280 = auVar65._0_32_;
              local_2a0 = auVar73._0_32_;
              local_318 = Disc;
              (*pGVar7->intersectionFilterN)(&local_310);
              auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar57 = ZEXT3264(local_2c0);
              auVar47 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar73 = ZEXT3264(local_2a0);
              auVar65 = ZEXT3264(local_280);
              Disc = local_318;
            }
            auVar62 = vpcmpeqd_avx(auVar61._0_16_,local_340);
            auVar11 = vpcmpeqd_avx(auVar61._0_16_,local_330);
            auVar28._16_16_ = auVar11;
            auVar28._0_16_ = auVar62;
            local_2c0 = auVar57._0_32_;
            auVar22 = local_2c0 & ~auVar28;
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar22 >> 0x7f,0) == '\0') &&
                  (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0xbf,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar22[0x1f]) {
              auVar23._0_4_ = auVar57._0_4_ ^ auVar62._0_4_;
              auVar23._4_4_ = auVar57._4_4_ ^ auVar62._4_4_;
              auVar23._8_4_ = auVar57._8_4_ ^ auVar62._8_4_;
              auVar23._12_4_ = auVar57._12_4_ ^ auVar62._12_4_;
              auVar23._16_4_ = auVar57._16_4_ ^ auVar11._0_4_;
              auVar23._20_4_ = auVar57._20_4_ ^ auVar11._4_4_;
              auVar23._24_4_ = auVar57._24_4_ ^ auVar11._8_4_;
              auVar23._28_4_ = auVar57._28_4_ ^ auVar11._12_4_;
            }
            else {
              p_Var10 = context->args->filter;
              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                local_280 = auVar65._0_32_;
                local_2a0 = auVar73._0_32_;
                (*p_Var10)(&local_310);
                auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar57 = ZEXT3264(local_2c0);
                auVar47 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar73 = ZEXT3264(local_2a0);
                auVar65 = ZEXT3264(local_280);
              }
              auVar62 = vpcmpeqd_avx(auVar61._0_16_,local_340);
              auVar11 = vpcmpeqd_avx(auVar61._0_16_,local_330);
              auVar26._16_16_ = auVar11;
              auVar26._0_16_ = auVar62;
              auVar23._0_4_ = auVar57._0_4_ ^ auVar62._0_4_;
              auVar23._4_4_ = auVar57._4_4_ ^ auVar62._4_4_;
              auVar23._8_4_ = auVar57._8_4_ ^ auVar62._8_4_;
              auVar23._12_4_ = auVar57._12_4_ ^ auVar62._12_4_;
              auVar23._16_4_ = auVar57._16_4_ ^ auVar11._0_4_;
              auVar23._20_4_ = auVar57._20_4_ ^ auVar11._4_4_;
              auVar23._24_4_ = auVar57._24_4_ ^ auVar11._8_4_;
              auVar23._28_4_ = auVar57._28_4_ ^ auVar11._12_4_;
              auVar22 = auVar57._0_32_ & ~auVar26;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])local_310.hit);
                *(undefined1 (*) [32])(local_310.ray + 0x180) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0x20));
                *(undefined1 (*) [32])(local_310.ray + 0x1a0) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0x40));
                *(undefined1 (*) [32])(local_310.ray + 0x1c0) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0x60));
                *(undefined1 (*) [32])(local_310.ray + 0x1e0) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0x80));
                *(undefined1 (*) [32])(local_310.ray + 0x200) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0xa0));
                *(undefined1 (*) [32])(local_310.ray + 0x220) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0xc0));
                *(undefined1 (*) [32])(local_310.ray + 0x240) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0xe0));
                *(undefined1 (*) [32])(local_310.ray + 0x260) = auVar22;
                auVar22 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(local_310.hit + 0x100));
                *(undefined1 (*) [32])(local_310.ray + 0x280) = auVar22;
              }
            }
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0x7f,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0xbf,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar23[0x1f]) {
              *(int *)(ray + k * 4 + 0x100) = auVar73._0_4_;
            }
            else {
              auVar73 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_2e0 + uVar20 * 4) = 0;
            auVar62 = vshufps_avx(auVar73._0_16_,auVar73._0_16_,0);
            auVar24._16_16_ = auVar62;
            auVar24._0_16_ = auVar62;
            auVar22 = vcmpps_avx(auVar65._0_32_,auVar24,2);
            local_2e0 = vandps_avx(auVar22,local_2e0);
          }
          if ((((((((local_2e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_2e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_2e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_2e0 >> 0x7f,0) == '\0') &&
                (local_2e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_2e0 >> 0xbf,0) == '\0') &&
              (local_2e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_2e0[0x1f]) {
            return;
          }
          auVar22 = vblendvps_avx(auVar47._0_32_,auVar65._0_32_,local_2e0);
          auVar13 = vshufps_avx(auVar22,auVar22,0xb1);
          auVar13 = vminps_avx(auVar22,auVar13);
          auVar21 = vshufpd_avx(auVar13,auVar13,5);
          auVar13 = vminps_avx(auVar13,auVar21);
          auVar21 = vperm2f128_avx(auVar13,auVar13,1);
          auVar13 = vminps_avx(auVar13,auVar21);
          auVar13 = vcmpps_avx(auVar22,auVar13,0);
          auVar21 = local_2e0 & auVar13;
          auVar22 = local_2e0;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0x7f,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0xbf,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar21[0x1f] < '\0') {
            auVar22 = vandps_avx(auVar13,local_2e0);
          }
          uVar17 = vmovmskps_avx(auVar22);
          uVar18 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }